

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

StorageView<std::allocator<absl::lts_20240722::status_internal::Payload>_> * __thiscall
absl::lts_20240722::inlined_vector_internal::
Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
::MakeStorageView(StorageView<std::allocator<absl::lts_20240722::status_internal::Payload>_>
                  *__return_storage_ptr__,
                 Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
                 *this)

{
  bool bVar1;
  Pointer<std::allocator<absl::lts_20240722::status_internal::Payload>_> pPVar2;
  SizeType<std::allocator<absl::lts_20240722::status_internal::Payload>_> SVar3;
  Storage<absl::lts_20240722::status_internal::Payload,_1UL,_std::allocator<absl::lts_20240722::status_internal::Payload>_>
  *this_local;
  
  bVar1 = GetIsAllocated(this);
  if (bVar1) {
    pPVar2 = GetAllocatedData(this);
    __return_storage_ptr__->data = pPVar2;
    SVar3 = GetSize(this);
    __return_storage_ptr__->size = SVar3;
    SVar3 = GetAllocatedCapacity(this);
    __return_storage_ptr__->capacity = SVar3;
  }
  else {
    pPVar2 = GetInlinedData(this);
    __return_storage_ptr__->data = pPVar2;
    SVar3 = GetSize(this);
    __return_storage_ptr__->size = SVar3;
    SVar3 = GetInlinedCapacity(this);
    __return_storage_ptr__->capacity = SVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

StorageView<A> MakeStorageView() {
    return GetIsAllocated() ? StorageView<A>{GetAllocatedData(), GetSize(),
                                             GetAllocatedCapacity()}
                            : StorageView<A>{GetInlinedData(), GetSize(),
                                             GetInlinedCapacity()};
  }